

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol_edge_state.cpp
# Opt level: O1

void EBMOL::ComputeEdgeState
               (Box *bx,Array4<double> *xedge,Array4<double> *yedge,Array4<double> *zedge,
               Array4<const_double> *q,int ncomp,Array4<const_double> *umac,
               Array4<const_double> *vmac,Array4<const_double> *wmac,Box *domain,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccc,Array4<const_double> *vfrac,
               Array4<const_amrex::EBCellFlag> *flag,bool is_velocity)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  BCRec *bcrec;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined8 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  undefined4 uVar95;
  undefined4 uVar96;
  undefined4 uVar97;
  undefined4 uVar98;
  pair<bool,_bool> pVar99;
  pair<bool,_bool> pVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  bool bVar110;
  undefined1 local_2c0 [528];
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  IndexType IStack_a0;
  undefined4 uStack_9c;
  double *local_98;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  undefined4 uStack_7c;
  Dim3 local_78;
  int iStack_6c;
  int iStack_68;
  undefined8 uStack_64;
  int local_5c;
  int local_58;
  bool local_54;
  ulong local_50;
  Array4<double> *local_48;
  Array4<double> *local_40;
  Array4<double> *local_38;
  
  iVar1 = (bx->smallend).vect[0];
  iVar2 = (bx->smallend).vect[1];
  iVar3 = (bx->smallend).vect[2];
  iVar4 = (bx->bigend).vect[0];
  iVar5 = (bx->bigend).vect[1];
  uVar6 = (bx->btype).itype;
  local_50 = (ulong)(~uVar6 & 1);
  iVar105 = iVar5 + (uint)((uVar6 & 2) == 0);
  iVar104 = (bx->bigend).vect[2];
  iVar101 = iVar104 + (uint)((uVar6 & 4) == 0);
  bcrec = (bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar106 = (~uVar6 & 1) + iVar4;
  iVar103 = (domain->smallend).vect[0];
  iVar102 = (domain->smallend).vect[2];
  iVar107 = (domain->bigend).vect[0];
  iVar109 = (domain->bigend).vect[2];
  local_48 = xedge;
  local_40 = yedge;
  local_38 = zedge;
  pVar99 = anon_unknown.dwarf_6ed2de::has_extdir_or_ho(bcrec,ncomp,0);
  pVar100 = anon_unknown.dwarf_6ed2de::has_extdir_or_ho(bcrec,ncomp,2);
  if ((iVar103 < iVar1 + -1 || (~pVar99.first & 1U) != 0) &&
     (((ushort)pVar99 >> 8 & 1) == 0 || iVar106 < iVar107)) {
    pVar99 = anon_unknown.dwarf_6ed2de::has_extdir_or_ho(bcrec,ncomp,1);
    if (((domain->smallend).vect[1] < iVar2 + -1 || (~pVar99.first & 1U) != 0) &&
       (((((ushort)pVar99 >> 8 & 1) == 0 || iVar105 < (domain->bigend).vect[1] &&
         (iVar102 < iVar3 + -1 || (~pVar100.first & 1U) != 0)) &&
        (((ushort)pVar100 >> 8 & 1) == 0 || iVar101 < iVar109)))) {
      local_2c0._0_8_ = d_bcrec_ptr;
      local_2c0._8_8_ = q->p;
      local_2c0._16_8_ = q->jstride;
      local_2c0._24_8_ = q->kstride;
      local_2c0._32_8_ = q->nstride;
      local_2c0._40_4_ = (q->begin).x;
      local_2c0._44_4_ = (q->begin).y;
      uVar7 = *(undefined8 *)&(q->begin).z;
      uVar8 = (q->end).y;
      local_2c0._60_8_ = *(undefined8 *)&(q->end).z;
      local_2c0._48_4_ = (undefined4)uVar7;
      local_2c0._52_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_2c0._72_8_ = ccc->p;
      local_2c0._80_8_ = ccc->jstride;
      local_2c0._88_8_ = ccc->kstride;
      local_2c0._96_8_ = ccc->nstride;
      local_2c0._104_4_ = (ccc->begin).x;
      local_2c0._108_4_ = (ccc->begin).y;
      uVar7 = *(undefined8 *)&(ccc->begin).z;
      uVar9 = (ccc->end).y;
      local_2c0._124_8_ = *(undefined8 *)&(ccc->end).z;
      local_2c0._112_4_ = (undefined4)uVar7;
      local_2c0._116_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_2c0._136_8_ = fcx->p;
      local_2c0._144_8_ = fcx->jstride;
      local_2c0._152_8_ = fcx->kstride;
      local_2c0._160_8_ = fcx->nstride;
      local_2c0._168_4_ = (fcx->begin).x;
      local_2c0._172_4_ = (fcx->begin).y;
      uVar10 = (fcx->end).x;
      uVar11 = (fcx->end).y;
      local_2c0._188_8_ = *(undefined8 *)&(fcx->end).z;
      local_2c0._176_4_ = (undefined4)*(undefined8 *)&(fcx->begin).z;
      local_2c0._200_8_ = fcy->p;
      local_2c0._208_8_ = fcy->jstride;
      local_2c0._216_8_ = fcy->kstride;
      local_2c0._224_8_ = fcy->nstride;
      local_2c0._232_4_ = (fcy->begin).x;
      local_2c0._236_4_ = (fcy->begin).y;
      uVar12 = (fcy->end).x;
      uVar13 = (fcy->end).y;
      local_2c0._252_8_ = *(undefined8 *)&(fcy->end).z;
      local_2c0._240_4_ = (undefined4)*(undefined8 *)&(fcy->begin).z;
      local_2c0._264_8_ = fcz->p;
      local_2c0._272_8_ = fcz->jstride;
      local_2c0._280_8_ = fcz->kstride;
      local_2c0._288_8_ = fcz->nstride;
      local_2c0._296_4_ = (fcz->begin).x;
      local_2c0._300_4_ = (fcz->begin).y;
      uVar14 = (fcz->end).x;
      uVar15 = (fcz->end).y;
      local_2c0._316_8_ = *(undefined8 *)&(fcz->end).z;
      local_2c0._304_4_ = (undefined4)*(undefined8 *)&(fcz->begin).z;
      local_2c0._328_8_ = flag->p;
      local_2c0._336_8_ = flag->jstride;
      local_2c0._344_8_ = flag->kstride;
      local_2c0._352_8_ = flag->nstride;
      local_2c0._360_4_ = (flag->begin).x;
      local_2c0._364_4_ = (flag->begin).y;
      uVar16 = (flag->end).x;
      uVar17 = (flag->end).y;
      local_2c0._380_8_ = *(undefined8 *)&(flag->end).z;
      local_2c0._368_4_ = (undefined4)*(undefined8 *)&(flag->begin).z;
      local_2c0._392_8_ = umac->p;
      local_2c0._400_8_ = umac->jstride;
      local_2c0._408_8_ = umac->kstride;
      local_2c0._416_8_ = umac->nstride;
      local_2c0._424_4_ = (umac->begin).x;
      local_2c0._428_4_ = (umac->begin).y;
      uVar7 = *(undefined8 *)&(umac->begin).z;
      uVar18 = (umac->end).y;
      local_2c0._444_8_ = *(undefined8 *)&(umac->end).z;
      local_2c0._432_4_ = (undefined4)uVar7;
      local_2c0._436_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_2c0._456_8_ = local_48->p;
      local_2c0._464_8_ = local_48->jstride;
      local_2c0._472_8_ = local_48->kstride;
      local_2c0._480_8_ = local_48->nstride;
      local_2c0._488_4_ = (local_48->begin).x;
      local_2c0._492_4_ = (local_48->begin).y;
      uVar19 = (local_48->end).x;
      uVar20 = (local_48->end).y;
      local_2c0._508_8_ = *(undefined8 *)&(local_48->end).z;
      local_2c0._496_4_ = (undefined4)*(undefined8 *)&(local_48->begin).z;
      local_2c0._520_8_ = vfrac->p;
      local_98 = *(double **)&vfrac->begin;
      uVar21 = (vfrac->end).x;
      uVar22 = (vfrac->end).y;
      uVar7 = *(undefined8 *)&(vfrac->end).z;
      iStack_b0 = (int)vfrac->jstride;
      iStack_ac = (int)((ulong)vfrac->jstride >> 0x20);
      local_a8 = (int)vfrac->kstride;
      iStack_a4 = (int)((ulong)vfrac->kstride >> 0x20);
      IStack_a0.itype = (uint)vfrac->nstride;
      uStack_9c = (undefined4)((ulong)vfrac->nstride >> 0x20);
      iStack_90 = (int)*(undefined8 *)&(vfrac->begin).z;
      iStack_84 = (int)uVar7;
      iStack_80 = (int)((ulong)uVar7 >> 0x20);
      local_78.x = (domain->smallend).vect[0];
      local_78.y = (domain->smallend).vect[1];
      uVar7 = *(undefined8 *)(domain->bigend).vect;
      uStack_64 = *(undefined8 *)((domain->bigend).vect + 2);
      local_78.z = (int)*(undefined8 *)((domain->smallend).vect + 2);
      iStack_6c = (int)uVar7;
      iStack_68 = (int)((ulong)uVar7 >> 0x20);
      local_5c = 2;
      local_58._0_1_ = is_velocity;
      if (0 < ncomp) {
        iVar103 = (int)local_50;
        iVar102 = 0;
        local_2c0._56_4_ = uVar8;
        local_2c0._120_4_ = uVar9;
        local_2c0._180_4_ = uVar10;
        local_2c0._184_4_ = uVar11;
        local_2c0._244_4_ = uVar12;
        local_2c0._248_4_ = uVar13;
        local_2c0._308_4_ = uVar14;
        local_2c0._312_4_ = uVar15;
        local_2c0._372_4_ = uVar16;
        local_2c0._376_4_ = uVar17;
        local_2c0._440_4_ = uVar18;
        local_2c0._500_4_ = uVar19;
        local_2c0._504_4_ = uVar20;
        iStack_8c = uVar21;
        local_88 = uVar22;
        do {
          iVar107 = iVar3;
          if (iVar3 <= iVar104) {
            do {
              iVar109 = iVar2;
              if (iVar2 <= iVar5) {
                do {
                  iVar108 = iVar1;
                  if (iVar1 <= iVar106) {
                    do {
                      ComputeEdgeState::anon_class_624_13_2da88530::operator()
                                ((anon_class_624_13_2da88530 *)local_2c0,iVar108,iVar109,iVar107,
                                 iVar102);
                      iVar108 = iVar108 + 1;
                    } while (iVar4 + iVar103 + 1 != iVar108);
                  }
                  bVar110 = iVar109 != iVar5;
                  iVar109 = iVar109 + 1;
                } while (bVar110);
              }
              bVar110 = iVar107 != iVar104;
              iVar107 = iVar107 + 1;
            } while (bVar110);
          }
          iVar102 = iVar102 + 1;
        } while (iVar102 != ncomp);
      }
      local_2c0._0_8_ = d_bcrec_ptr;
      local_2c0._8_8_ = q->p;
      local_2c0._16_8_ = q->jstride;
      local_2c0._24_8_ = q->kstride;
      local_2c0._32_8_ = q->nstride;
      local_2c0._40_4_ = (q->begin).x;
      local_2c0._44_4_ = (q->begin).y;
      uVar7 = *(undefined8 *)&(q->begin).z;
      uVar23 = (q->end).y;
      local_2c0._60_8_ = *(undefined8 *)&(q->end).z;
      local_2c0._48_4_ = (undefined4)uVar7;
      local_2c0._52_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_2c0._72_8_ = ccc->p;
      local_2c0._80_8_ = ccc->jstride;
      local_2c0._88_8_ = ccc->kstride;
      local_2c0._96_8_ = ccc->nstride;
      local_2c0._104_4_ = (ccc->begin).x;
      local_2c0._108_4_ = (ccc->begin).y;
      uVar7 = *(undefined8 *)&(ccc->begin).z;
      uVar24 = (ccc->end).y;
      local_2c0._124_8_ = *(undefined8 *)&(ccc->end).z;
      local_2c0._112_4_ = (undefined4)uVar7;
      local_2c0._116_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_2c0._136_8_ = fcx->p;
      local_2c0._144_8_ = fcx->jstride;
      local_2c0._152_8_ = fcx->kstride;
      local_2c0._160_8_ = fcx->nstride;
      local_2c0._168_4_ = (fcx->begin).x;
      local_2c0._172_4_ = (fcx->begin).y;
      uVar25 = (fcx->end).x;
      uVar26 = (fcx->end).y;
      local_2c0._188_8_ = *(undefined8 *)&(fcx->end).z;
      local_2c0._176_4_ = (undefined4)*(undefined8 *)&(fcx->begin).z;
      local_2c0._200_8_ = fcy->p;
      local_2c0._208_8_ = fcy->jstride;
      local_2c0._216_8_ = fcy->kstride;
      local_2c0._224_8_ = fcy->nstride;
      local_2c0._232_4_ = (fcy->begin).x;
      local_2c0._236_4_ = (fcy->begin).y;
      uVar27 = (fcy->end).x;
      uVar28 = (fcy->end).y;
      local_2c0._252_8_ = *(undefined8 *)&(fcy->end).z;
      local_2c0._240_4_ = (undefined4)*(undefined8 *)&(fcy->begin).z;
      local_2c0._264_8_ = fcz->p;
      local_2c0._272_8_ = fcz->jstride;
      local_2c0._280_8_ = fcz->kstride;
      local_2c0._288_8_ = fcz->nstride;
      local_2c0._296_4_ = (fcz->begin).x;
      local_2c0._300_4_ = (fcz->begin).y;
      uVar29 = (fcz->end).x;
      uVar30 = (fcz->end).y;
      local_2c0._316_8_ = *(undefined8 *)&(fcz->end).z;
      local_2c0._304_4_ = (undefined4)*(undefined8 *)&(fcz->begin).z;
      local_2c0._328_8_ = flag->p;
      local_2c0._336_8_ = flag->jstride;
      local_2c0._344_8_ = flag->kstride;
      local_2c0._352_8_ = flag->nstride;
      local_2c0._360_4_ = (flag->begin).x;
      local_2c0._364_4_ = (flag->begin).y;
      uVar31 = (flag->end).x;
      uVar32 = (flag->end).y;
      local_2c0._380_8_ = *(undefined8 *)&(flag->end).z;
      local_2c0._368_4_ = (undefined4)*(undefined8 *)&(flag->begin).z;
      local_2c0._392_8_ = vmac->p;
      local_2c0._400_8_ = vmac->jstride;
      local_2c0._408_8_ = vmac->kstride;
      local_2c0._416_8_ = vmac->nstride;
      local_2c0._424_4_ = (vmac->begin).x;
      local_2c0._428_4_ = (vmac->begin).y;
      uVar7 = *(undefined8 *)&(vmac->begin).z;
      uVar33 = (vmac->end).y;
      local_2c0._444_8_ = *(undefined8 *)&(vmac->end).z;
      local_2c0._432_4_ = (undefined4)uVar7;
      local_2c0._436_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_2c0._456_8_ = local_40->p;
      local_2c0._464_8_ = local_40->jstride;
      local_2c0._472_8_ = local_40->kstride;
      local_2c0._480_8_ = local_40->nstride;
      local_2c0._488_4_ = (local_40->begin).x;
      local_2c0._492_4_ = (local_40->begin).y;
      uVar34 = (local_40->end).x;
      uVar35 = (local_40->end).y;
      local_2c0._508_8_ = *(undefined8 *)&(local_40->end).z;
      local_2c0._496_4_ = (undefined4)*(undefined8 *)&(local_40->begin).z;
      local_2c0._520_8_ = vfrac->p;
      local_98 = *(double **)&vfrac->begin;
      uVar36 = (vfrac->end).x;
      uVar37 = (vfrac->end).y;
      uVar7 = *(undefined8 *)&(vfrac->end).z;
      iStack_b0 = (int)vfrac->jstride;
      iStack_ac = (int)((ulong)vfrac->jstride >> 0x20);
      local_a8 = (int)vfrac->kstride;
      iStack_a4 = (int)((ulong)vfrac->kstride >> 0x20);
      IStack_a0.itype = (uint)vfrac->nstride;
      uStack_9c = (undefined4)((ulong)vfrac->nstride >> 0x20);
      iStack_90 = (int)*(undefined8 *)&(vfrac->begin).z;
      iStack_84 = (int)uVar7;
      iStack_80 = (int)((ulong)uVar7 >> 0x20);
      local_78.x = (domain->smallend).vect[0];
      local_78.y = (domain->smallend).vect[1];
      uVar7 = *(undefined8 *)(domain->bigend).vect;
      uStack_64 = *(undefined8 *)((domain->bigend).vect + 2);
      local_78.z = (int)*(undefined8 *)((domain->smallend).vect + 2);
      iStack_6c = (int)uVar7;
      iStack_68 = (int)((ulong)uVar7 >> 0x20);
      local_5c = 2;
      local_58._0_1_ = is_velocity;
      if (0 < ncomp) {
        iVar103 = 0;
        local_2c0._56_4_ = uVar23;
        local_2c0._120_4_ = uVar24;
        local_2c0._180_4_ = uVar25;
        local_2c0._184_4_ = uVar26;
        local_2c0._244_4_ = uVar27;
        local_2c0._248_4_ = uVar28;
        local_2c0._308_4_ = uVar29;
        local_2c0._312_4_ = uVar30;
        local_2c0._372_4_ = uVar31;
        local_2c0._376_4_ = uVar32;
        local_2c0._440_4_ = uVar33;
        local_2c0._500_4_ = uVar34;
        local_2c0._504_4_ = uVar35;
        iStack_8c = uVar36;
        local_88 = uVar37;
        do {
          iVar102 = iVar3;
          if (iVar3 <= iVar104) {
            do {
              iVar107 = iVar2;
              if (iVar2 <= iVar105) {
                do {
                  iVar109 = iVar1;
                  if (iVar1 <= iVar4) {
                    do {
                      ComputeEdgeState::anon_class_624_13_56316332::operator()
                                ((anon_class_624_13_56316332 *)local_2c0,iVar109,iVar107,iVar102,
                                 iVar103);
                      iVar109 = iVar109 + 1;
                    } while (iVar4 + 1 != iVar109);
                  }
                  bVar110 = iVar107 != iVar105;
                  iVar107 = iVar107 + 1;
                } while (bVar110);
              }
              bVar110 = iVar102 != iVar104;
              iVar102 = iVar102 + 1;
            } while (bVar110);
          }
          iVar103 = iVar103 + 1;
        } while (iVar103 != ncomp);
      }
      local_2c0._0_8_ = d_bcrec_ptr;
      local_2c0._8_8_ = q->p;
      local_2c0._16_8_ = q->jstride;
      local_2c0._24_8_ = q->kstride;
      local_2c0._32_8_ = q->nstride;
      local_2c0._40_4_ = (q->begin).x;
      local_2c0._44_4_ = (q->begin).y;
      uVar7 = *(undefined8 *)&(q->begin).z;
      uVar38 = (q->end).y;
      local_2c0._60_8_ = *(undefined8 *)&(q->end).z;
      local_2c0._48_4_ = (undefined4)uVar7;
      local_2c0._52_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_2c0._72_8_ = ccc->p;
      local_2c0._80_8_ = ccc->jstride;
      local_2c0._88_8_ = ccc->kstride;
      local_2c0._96_8_ = ccc->nstride;
      local_2c0._104_4_ = (ccc->begin).x;
      local_2c0._108_4_ = (ccc->begin).y;
      uVar7 = *(undefined8 *)&(ccc->begin).z;
      uVar39 = (ccc->end).y;
      local_2c0._124_8_ = *(undefined8 *)&(ccc->end).z;
      local_2c0._112_4_ = (undefined4)uVar7;
      local_2c0._116_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_2c0._136_8_ = fcx->p;
      local_2c0._144_8_ = fcx->jstride;
      local_2c0._152_8_ = fcx->kstride;
      local_2c0._160_8_ = fcx->nstride;
      local_2c0._168_4_ = (fcx->begin).x;
      local_2c0._172_4_ = (fcx->begin).y;
      uVar40 = (fcx->end).x;
      uVar41 = (fcx->end).y;
      local_2c0._188_8_ = *(undefined8 *)&(fcx->end).z;
      local_2c0._176_4_ = (undefined4)*(undefined8 *)&(fcx->begin).z;
      local_2c0._200_8_ = fcy->p;
      local_2c0._208_8_ = fcy->jstride;
      local_2c0._216_8_ = fcy->kstride;
      local_2c0._224_8_ = fcy->nstride;
      local_2c0._232_4_ = (fcy->begin).x;
      local_2c0._236_4_ = (fcy->begin).y;
      uVar42 = (fcy->end).x;
      uVar43 = (fcy->end).y;
      local_2c0._252_8_ = *(undefined8 *)&(fcy->end).z;
      local_2c0._240_4_ = (undefined4)*(undefined8 *)&(fcy->begin).z;
      local_2c0._264_8_ = fcz->p;
      local_2c0._272_8_ = fcz->jstride;
      local_2c0._280_8_ = fcz->kstride;
      local_2c0._288_8_ = fcz->nstride;
      local_2c0._296_4_ = (fcz->begin).x;
      local_2c0._300_4_ = (fcz->begin).y;
      uVar44 = (fcz->end).x;
      uVar45 = (fcz->end).y;
      local_2c0._316_8_ = *(undefined8 *)&(fcz->end).z;
      local_2c0._304_4_ = (undefined4)*(undefined8 *)&(fcz->begin).z;
      local_2c0._328_8_ = flag->p;
      local_2c0._336_8_ = flag->jstride;
      local_2c0._344_8_ = flag->kstride;
      local_2c0._352_8_ = flag->nstride;
      local_2c0._360_4_ = (flag->begin).x;
      local_2c0._364_4_ = (flag->begin).y;
      uVar46 = (flag->end).x;
      uVar47 = (flag->end).y;
      local_2c0._380_8_ = *(undefined8 *)&(flag->end).z;
      local_2c0._368_4_ = (undefined4)*(undefined8 *)&(flag->begin).z;
      local_2c0._392_8_ = wmac->p;
      local_2c0._400_8_ = wmac->jstride;
      local_2c0._408_8_ = wmac->kstride;
      local_2c0._416_8_ = wmac->nstride;
      local_2c0._424_4_ = (wmac->begin).x;
      local_2c0._428_4_ = (wmac->begin).y;
      uVar7 = *(undefined8 *)&(wmac->begin).z;
      uVar48 = (wmac->end).y;
      local_2c0._444_8_ = *(undefined8 *)&(wmac->end).z;
      local_2c0._432_4_ = (undefined4)uVar7;
      local_2c0._436_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_2c0._456_8_ = local_38->p;
      local_2c0._464_8_ = local_38->jstride;
      local_2c0._472_8_ = local_38->kstride;
      local_2c0._480_8_ = local_38->nstride;
      local_2c0._488_4_ = (local_38->begin).x;
      local_2c0._492_4_ = (local_38->begin).y;
      uVar49 = (local_38->end).x;
      uVar50 = (local_38->end).y;
      local_2c0._508_8_ = *(undefined8 *)&(local_38->end).z;
      local_2c0._496_4_ = (undefined4)*(undefined8 *)&(local_38->begin).z;
      local_2c0._520_8_ = vfrac->p;
      local_98 = *(double **)&vfrac->begin;
      uVar51 = (vfrac->end).x;
      uVar52 = (vfrac->end).y;
      uVar7 = *(undefined8 *)&(vfrac->end).z;
      iStack_b0 = (int)vfrac->jstride;
      iStack_ac = (int)((ulong)vfrac->jstride >> 0x20);
      local_a8 = (int)vfrac->kstride;
      iStack_a4 = (int)((ulong)vfrac->kstride >> 0x20);
      IStack_a0.itype = (uint)vfrac->nstride;
      uStack_9c = (undefined4)((ulong)vfrac->nstride >> 0x20);
      iStack_90 = (int)*(undefined8 *)&(vfrac->begin).z;
      iStack_84 = (int)uVar7;
      iStack_80 = (int)((ulong)uVar7 >> 0x20);
      local_78.x = (domain->smallend).vect[0];
      local_78.y = (domain->smallend).vect[1];
      uVar7 = *(undefined8 *)(domain->bigend).vect;
      uStack_64 = *(undefined8 *)((domain->bigend).vect + 2);
      local_78.z = (int)*(undefined8 *)((domain->smallend).vect + 2);
      iStack_6c = (int)uVar7;
      iStack_68 = (int)((ulong)uVar7 >> 0x20);
      local_5c = 2;
      local_58 = CONCAT31(local_58._1_3_,is_velocity);
      if (ncomp < 1) {
        return;
      }
      iVar104 = 0;
      local_2c0._56_4_ = uVar38;
      local_2c0._120_4_ = uVar39;
      local_2c0._180_4_ = uVar40;
      local_2c0._184_4_ = uVar41;
      local_2c0._244_4_ = uVar42;
      local_2c0._248_4_ = uVar43;
      local_2c0._308_4_ = uVar44;
      local_2c0._312_4_ = uVar45;
      local_2c0._372_4_ = uVar46;
      local_2c0._376_4_ = uVar47;
      local_2c0._440_4_ = uVar48;
      local_2c0._500_4_ = uVar49;
      local_2c0._504_4_ = uVar50;
      iStack_8c = uVar51;
      local_88 = uVar52;
      do {
        iVar103 = iVar3;
        if (iVar3 <= iVar101) {
          do {
            iVar102 = iVar2;
            if (iVar2 <= iVar5) {
              do {
                iVar107 = iVar1;
                if (iVar1 <= iVar4) {
                  do {
                    ComputeEdgeState::anon_class_624_13_7eba4134::operator()
                              ((anon_class_624_13_7eba4134 *)local_2c0,iVar107,iVar102,iVar103,
                               iVar104);
                    iVar107 = iVar107 + 1;
                  } while (iVar4 + 1 != iVar107);
                }
                bVar110 = iVar102 != iVar5;
                iVar102 = iVar102 + 1;
              } while (bVar110);
            }
            bVar110 = iVar103 != iVar101;
            iVar103 = iVar103 + 1;
          } while (bVar110);
        }
        iVar104 = iVar104 + 1;
      } while (iVar104 != ncomp);
      return;
    }
  }
  local_2c0._0_8_ = d_bcrec_ptr;
  local_2c0._8_8_ = q->p;
  local_2c0._16_8_ = q->jstride;
  local_2c0._24_8_ = q->kstride;
  local_2c0._32_8_ = q->nstride;
  local_2c0._40_4_ = (q->begin).x;
  local_2c0._44_4_ = (q->begin).y;
  uVar7 = *(undefined8 *)&(q->begin).z;
  uVar53 = (q->end).y;
  local_2c0._60_8_ = *(undefined8 *)&(q->end).z;
  local_2c0._48_4_ = (undefined4)uVar7;
  local_2c0._52_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  local_2c0._72_8_ = ccc->p;
  local_2c0._80_8_ = ccc->jstride;
  local_2c0._88_8_ = ccc->kstride;
  local_2c0._96_8_ = ccc->nstride;
  local_2c0._104_4_ = (ccc->begin).x;
  local_2c0._108_4_ = (ccc->begin).y;
  uVar7 = *(undefined8 *)&(ccc->begin).z;
  uVar54 = (ccc->end).y;
  local_2c0._124_8_ = *(undefined8 *)&(ccc->end).z;
  local_2c0._112_4_ = (undefined4)uVar7;
  local_2c0._116_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  local_2c0._136_8_ = fcx->p;
  local_2c0._144_8_ = fcx->jstride;
  local_2c0._152_8_ = fcx->kstride;
  local_2c0._160_8_ = fcx->nstride;
  local_2c0._168_4_ = (fcx->begin).x;
  local_2c0._172_4_ = (fcx->begin).y;
  uVar55 = (fcx->end).x;
  uVar56 = (fcx->end).y;
  local_2c0._188_8_ = *(undefined8 *)&(fcx->end).z;
  local_2c0._176_4_ = (undefined4)*(undefined8 *)&(fcx->begin).z;
  local_2c0._200_8_ = fcy->p;
  local_2c0._208_8_ = fcy->jstride;
  local_2c0._216_8_ = fcy->kstride;
  local_2c0._224_8_ = fcy->nstride;
  local_2c0._232_4_ = (fcy->begin).x;
  local_2c0._236_4_ = (fcy->begin).y;
  uVar57 = (fcy->end).x;
  uVar58 = (fcy->end).y;
  local_2c0._252_8_ = *(undefined8 *)&(fcy->end).z;
  local_2c0._240_4_ = (undefined4)*(undefined8 *)&(fcy->begin).z;
  local_2c0._264_8_ = fcz->p;
  local_2c0._272_8_ = fcz->jstride;
  local_2c0._280_8_ = fcz->kstride;
  local_2c0._288_8_ = fcz->nstride;
  local_2c0._296_4_ = (fcz->begin).x;
  local_2c0._300_4_ = (fcz->begin).y;
  uVar59 = (fcz->end).x;
  uVar60 = (fcz->end).y;
  local_2c0._316_8_ = *(undefined8 *)&(fcz->end).z;
  local_2c0._304_4_ = (undefined4)*(undefined8 *)&(fcz->begin).z;
  local_2c0._328_8_ = flag->p;
  local_2c0._336_8_ = flag->jstride;
  local_2c0._344_8_ = flag->kstride;
  local_2c0._352_8_ = flag->nstride;
  local_2c0._360_4_ = (flag->begin).x;
  local_2c0._364_4_ = (flag->begin).y;
  uVar61 = (flag->end).x;
  uVar62 = (flag->end).y;
  local_2c0._380_8_ = *(undefined8 *)&(flag->end).z;
  local_2c0._368_4_ = (undefined4)*(undefined8 *)&(flag->begin).z;
  local_2c0._392_8_ = umac->p;
  local_2c0._400_8_ = umac->jstride;
  local_2c0._408_8_ = umac->kstride;
  local_2c0._416_8_ = umac->nstride;
  local_2c0._424_4_ = (umac->begin).x;
  local_2c0._428_4_ = (umac->begin).y;
  uVar7 = *(undefined8 *)&(umac->begin).z;
  uVar63 = (umac->end).y;
  local_2c0._444_8_ = *(undefined8 *)&(umac->end).z;
  local_2c0._432_4_ = (undefined4)uVar7;
  local_2c0._436_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  local_2c0._456_8_ = local_48->p;
  local_2c0._464_8_ = local_48->jstride;
  local_2c0._472_8_ = local_48->kstride;
  local_2c0._480_8_ = local_48->nstride;
  local_2c0._488_4_ = (local_48->begin).x;
  local_2c0._492_4_ = (local_48->begin).y;
  uVar64 = (local_48->end).x;
  uVar65 = (local_48->end).y;
  local_2c0._508_8_ = *(undefined8 *)&(local_48->end).z;
  local_2c0._496_4_ = (undefined4)*(undefined8 *)&(local_48->begin).z;
  local_2c0._520_8_ = *(undefined8 *)(domain->smallend).vect;
  uVar7 = *(undefined8 *)(domain->bigend).vect;
  uVar66 = *(undefined8 *)((domain->bigend).vect + 2);
  iStack_b0 = (int)*(undefined8 *)((domain->smallend).vect + 2);
  iStack_ac = (int)uVar7;
  local_a8 = (int)((ulong)uVar7 >> 0x20);
  iStack_a4 = (int)uVar66;
  IStack_a0.itype = (uint)((ulong)uVar66 >> 0x20);
  local_98 = vfrac->p;
  local_78.x = (vfrac->begin).x;
  local_78.y = (vfrac->begin).y;
  uVar67 = (vfrac->end).x;
  uVar68 = (vfrac->end).y;
  uStack_64 = *(undefined8 *)&(vfrac->end).z;
  iStack_90 = (int)vfrac->jstride;
  iStack_8c = (int)((ulong)vfrac->jstride >> 0x20);
  local_88 = (int)vfrac->kstride;
  iStack_84 = (int)((ulong)vfrac->kstride >> 0x20);
  iStack_80 = (int)vfrac->nstride;
  uStack_7c = (undefined4)((ulong)vfrac->nstride >> 0x20);
  local_78.z = (int)*(undefined8 *)&(vfrac->begin).z;
  local_58 = 2;
  local_54 = is_velocity;
  if (0 < ncomp) {
    iVar103 = (int)local_50;
    iVar102 = 0;
    local_2c0._56_4_ = uVar53;
    local_2c0._120_4_ = uVar54;
    local_2c0._180_4_ = uVar55;
    local_2c0._184_4_ = uVar56;
    local_2c0._244_4_ = uVar57;
    local_2c0._248_4_ = uVar58;
    local_2c0._308_4_ = uVar59;
    local_2c0._312_4_ = uVar60;
    local_2c0._372_4_ = uVar61;
    local_2c0._376_4_ = uVar62;
    local_2c0._440_4_ = uVar63;
    local_2c0._500_4_ = uVar64;
    local_2c0._504_4_ = uVar65;
    iStack_6c = uVar67;
    iStack_68 = uVar68;
    do {
      iVar107 = iVar3;
      if (iVar3 <= iVar104) {
        do {
          iVar109 = iVar2;
          if (iVar2 <= iVar5) {
            do {
              iVar108 = iVar1;
              if (iVar1 <= iVar106) {
                do {
                  ComputeEdgeState::anon_class_624_13_64a6b87d::operator()
                            ((anon_class_624_13_64a6b87d *)local_2c0,iVar108,iVar109,iVar107,iVar102
                            );
                  iVar108 = iVar108 + 1;
                } while (iVar4 + iVar103 + 1 != iVar108);
              }
              bVar110 = iVar109 != iVar5;
              iVar109 = iVar109 + 1;
            } while (bVar110);
          }
          bVar110 = iVar107 != iVar104;
          iVar107 = iVar107 + 1;
        } while (bVar110);
      }
      iVar102 = iVar102 + 1;
    } while (iVar102 != ncomp);
  }
  local_2c0._0_8_ = d_bcrec_ptr;
  local_2c0._8_8_ = q->p;
  local_2c0._16_8_ = q->jstride;
  local_2c0._24_8_ = q->kstride;
  local_2c0._32_8_ = q->nstride;
  local_2c0._40_4_ = (q->begin).x;
  local_2c0._44_4_ = (q->begin).y;
  uVar7 = *(undefined8 *)&(q->begin).z;
  uVar69 = (q->end).y;
  local_2c0._60_8_ = *(undefined8 *)&(q->end).z;
  local_2c0._48_4_ = (undefined4)uVar7;
  local_2c0._52_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  local_2c0._72_8_ = ccc->p;
  local_2c0._80_8_ = ccc->jstride;
  local_2c0._88_8_ = ccc->kstride;
  local_2c0._96_8_ = ccc->nstride;
  local_2c0._104_4_ = (ccc->begin).x;
  local_2c0._108_4_ = (ccc->begin).y;
  uVar7 = *(undefined8 *)&(ccc->begin).z;
  uVar70 = (ccc->end).y;
  local_2c0._124_8_ = *(undefined8 *)&(ccc->end).z;
  local_2c0._112_4_ = (undefined4)uVar7;
  local_2c0._116_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  local_2c0._136_8_ = fcx->p;
  local_2c0._144_8_ = fcx->jstride;
  local_2c0._152_8_ = fcx->kstride;
  local_2c0._160_8_ = fcx->nstride;
  local_2c0._168_4_ = (fcx->begin).x;
  local_2c0._172_4_ = (fcx->begin).y;
  uVar71 = (fcx->end).x;
  uVar72 = (fcx->end).y;
  local_2c0._188_8_ = *(undefined8 *)&(fcx->end).z;
  local_2c0._176_4_ = (undefined4)*(undefined8 *)&(fcx->begin).z;
  local_2c0._200_8_ = fcy->p;
  local_2c0._208_8_ = fcy->jstride;
  local_2c0._216_8_ = fcy->kstride;
  local_2c0._224_8_ = fcy->nstride;
  local_2c0._232_4_ = (fcy->begin).x;
  local_2c0._236_4_ = (fcy->begin).y;
  uVar73 = (fcy->end).x;
  uVar74 = (fcy->end).y;
  local_2c0._252_8_ = *(undefined8 *)&(fcy->end).z;
  local_2c0._240_4_ = (undefined4)*(undefined8 *)&(fcy->begin).z;
  local_2c0._264_8_ = fcz->p;
  local_2c0._272_8_ = fcz->jstride;
  local_2c0._280_8_ = fcz->kstride;
  local_2c0._288_8_ = fcz->nstride;
  local_2c0._296_4_ = (fcz->begin).x;
  local_2c0._300_4_ = (fcz->begin).y;
  uVar75 = (fcz->end).x;
  uVar76 = (fcz->end).y;
  local_2c0._316_8_ = *(undefined8 *)&(fcz->end).z;
  local_2c0._304_4_ = (undefined4)*(undefined8 *)&(fcz->begin).z;
  local_2c0._328_8_ = flag->p;
  local_2c0._336_8_ = flag->jstride;
  local_2c0._344_8_ = flag->kstride;
  local_2c0._352_8_ = flag->nstride;
  local_2c0._360_4_ = (flag->begin).x;
  local_2c0._364_4_ = (flag->begin).y;
  uVar77 = (flag->end).x;
  uVar78 = (flag->end).y;
  local_2c0._380_8_ = *(undefined8 *)&(flag->end).z;
  local_2c0._368_4_ = (undefined4)*(undefined8 *)&(flag->begin).z;
  local_2c0._392_8_ = vmac->p;
  local_2c0._400_8_ = vmac->jstride;
  local_2c0._408_8_ = vmac->kstride;
  local_2c0._416_8_ = vmac->nstride;
  local_2c0._424_4_ = (vmac->begin).x;
  local_2c0._428_4_ = (vmac->begin).y;
  uVar7 = *(undefined8 *)&(vmac->begin).z;
  uVar79 = (vmac->end).y;
  local_2c0._444_8_ = *(undefined8 *)&(vmac->end).z;
  local_2c0._432_4_ = (undefined4)uVar7;
  local_2c0._436_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  local_2c0._456_8_ = local_40->p;
  local_2c0._464_8_ = local_40->jstride;
  local_2c0._472_8_ = local_40->kstride;
  local_2c0._480_8_ = local_40->nstride;
  local_2c0._488_4_ = (local_40->begin).x;
  local_2c0._492_4_ = (local_40->begin).y;
  uVar80 = (local_40->end).x;
  uVar81 = (local_40->end).y;
  local_2c0._508_8_ = *(undefined8 *)&(local_40->end).z;
  local_2c0._496_4_ = (undefined4)*(undefined8 *)&(local_40->begin).z;
  local_2c0._520_8_ = *(undefined8 *)(domain->smallend).vect;
  uVar7 = *(undefined8 *)(domain->bigend).vect;
  uVar66 = *(undefined8 *)((domain->bigend).vect + 2);
  iStack_b0 = (int)*(undefined8 *)((domain->smallend).vect + 2);
  iStack_ac = (int)uVar7;
  local_a8 = (int)((ulong)uVar7 >> 0x20);
  iStack_a4 = (int)uVar66;
  IStack_a0.itype = (uint)((ulong)uVar66 >> 0x20);
  local_98 = vfrac->p;
  local_78.x = (vfrac->begin).x;
  local_78.y = (vfrac->begin).y;
  uVar82 = (vfrac->end).x;
  uVar83 = (vfrac->end).y;
  uStack_64 = *(undefined8 *)&(vfrac->end).z;
  iStack_90 = (int)vfrac->jstride;
  iStack_8c = (int)((ulong)vfrac->jstride >> 0x20);
  local_88 = (int)vfrac->kstride;
  iStack_84 = (int)((ulong)vfrac->kstride >> 0x20);
  iStack_80 = (int)vfrac->nstride;
  uStack_7c = (undefined4)((ulong)vfrac->nstride >> 0x20);
  local_78.z = (int)*(undefined8 *)&(vfrac->begin).z;
  local_58 = 2;
  local_54 = is_velocity;
  if (0 < ncomp) {
    iVar103 = 0;
    local_2c0._56_4_ = uVar69;
    local_2c0._120_4_ = uVar70;
    local_2c0._180_4_ = uVar71;
    local_2c0._184_4_ = uVar72;
    local_2c0._244_4_ = uVar73;
    local_2c0._248_4_ = uVar74;
    local_2c0._308_4_ = uVar75;
    local_2c0._312_4_ = uVar76;
    local_2c0._372_4_ = uVar77;
    local_2c0._376_4_ = uVar78;
    local_2c0._440_4_ = uVar79;
    local_2c0._500_4_ = uVar80;
    local_2c0._504_4_ = uVar81;
    iStack_6c = uVar82;
    iStack_68 = uVar83;
    do {
      iVar102 = iVar3;
      if (iVar3 <= iVar104) {
        do {
          iVar107 = iVar2;
          if (iVar2 <= iVar105) {
            do {
              iVar109 = iVar1;
              if (iVar1 <= iVar4) {
                do {
                  ComputeEdgeState::anon_class_624_13_8d2f967f::operator()
                            ((anon_class_624_13_8d2f967f *)local_2c0,iVar109,iVar107,iVar102,iVar103
                            );
                  iVar109 = iVar109 + 1;
                } while (iVar4 + 1 != iVar109);
              }
              bVar110 = iVar107 != iVar105;
              iVar107 = iVar107 + 1;
            } while (bVar110);
          }
          bVar110 = iVar102 != iVar104;
          iVar102 = iVar102 + 1;
        } while (bVar110);
      }
      iVar103 = iVar103 + 1;
    } while (iVar103 != ncomp);
  }
  local_2c0._0_8_ = d_bcrec_ptr;
  local_2c0._8_8_ = q->p;
  local_2c0._16_8_ = q->jstride;
  local_2c0._24_8_ = q->kstride;
  local_2c0._32_8_ = q->nstride;
  local_2c0._40_4_ = (q->begin).x;
  local_2c0._44_4_ = (q->begin).y;
  uVar7 = *(undefined8 *)&(q->begin).z;
  uVar84 = (q->end).y;
  local_2c0._60_8_ = *(undefined8 *)&(q->end).z;
  local_2c0._48_4_ = (undefined4)uVar7;
  local_2c0._52_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  local_2c0._72_8_ = ccc->p;
  local_2c0._80_8_ = ccc->jstride;
  local_2c0._88_8_ = ccc->kstride;
  local_2c0._96_8_ = ccc->nstride;
  local_2c0._104_4_ = (ccc->begin).x;
  local_2c0._108_4_ = (ccc->begin).y;
  uVar7 = *(undefined8 *)&(ccc->begin).z;
  uVar85 = (ccc->end).y;
  local_2c0._124_8_ = *(undefined8 *)&(ccc->end).z;
  local_2c0._112_4_ = (undefined4)uVar7;
  local_2c0._116_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  local_2c0._136_8_ = fcx->p;
  local_2c0._144_8_ = fcx->jstride;
  local_2c0._152_8_ = fcx->kstride;
  local_2c0._160_8_ = fcx->nstride;
  local_2c0._168_4_ = (fcx->begin).x;
  local_2c0._172_4_ = (fcx->begin).y;
  uVar86 = (fcx->end).x;
  uVar87 = (fcx->end).y;
  local_2c0._188_8_ = *(undefined8 *)&(fcx->end).z;
  local_2c0._176_4_ = (undefined4)*(undefined8 *)&(fcx->begin).z;
  local_2c0._200_8_ = fcy->p;
  local_2c0._208_8_ = fcy->jstride;
  local_2c0._216_8_ = fcy->kstride;
  local_2c0._224_8_ = fcy->nstride;
  local_2c0._232_4_ = (fcy->begin).x;
  local_2c0._236_4_ = (fcy->begin).y;
  uVar88 = (fcy->end).x;
  uVar89 = (fcy->end).y;
  local_2c0._252_8_ = *(undefined8 *)&(fcy->end).z;
  local_2c0._240_4_ = (undefined4)*(undefined8 *)&(fcy->begin).z;
  local_2c0._264_8_ = fcz->p;
  local_2c0._272_8_ = fcz->jstride;
  local_2c0._280_8_ = fcz->kstride;
  local_2c0._288_8_ = fcz->nstride;
  local_2c0._296_4_ = (fcz->begin).x;
  local_2c0._300_4_ = (fcz->begin).y;
  uVar90 = (fcz->end).x;
  uVar91 = (fcz->end).y;
  local_2c0._316_8_ = *(undefined8 *)&(fcz->end).z;
  local_2c0._304_4_ = (undefined4)*(undefined8 *)&(fcz->begin).z;
  local_2c0._328_8_ = flag->p;
  local_2c0._336_8_ = flag->jstride;
  local_2c0._344_8_ = flag->kstride;
  local_2c0._352_8_ = flag->nstride;
  local_2c0._360_4_ = (flag->begin).x;
  local_2c0._364_4_ = (flag->begin).y;
  uVar92 = (flag->end).x;
  uVar93 = (flag->end).y;
  local_2c0._380_8_ = *(undefined8 *)&(flag->end).z;
  local_2c0._368_4_ = (undefined4)*(undefined8 *)&(flag->begin).z;
  local_2c0._392_8_ = wmac->p;
  local_2c0._400_8_ = wmac->jstride;
  local_2c0._408_8_ = wmac->kstride;
  local_2c0._416_8_ = wmac->nstride;
  local_2c0._424_4_ = (wmac->begin).x;
  local_2c0._428_4_ = (wmac->begin).y;
  uVar7 = *(undefined8 *)&(wmac->begin).z;
  uVar94 = (wmac->end).y;
  local_2c0._444_8_ = *(undefined8 *)&(wmac->end).z;
  local_2c0._432_4_ = (undefined4)uVar7;
  local_2c0._436_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  local_2c0._456_8_ = local_38->p;
  local_2c0._464_8_ = local_38->jstride;
  local_2c0._472_8_ = local_38->kstride;
  local_2c0._480_8_ = local_38->nstride;
  local_2c0._488_4_ = (local_38->begin).x;
  local_2c0._492_4_ = (local_38->begin).y;
  uVar95 = (local_38->end).x;
  uVar96 = (local_38->end).y;
  local_2c0._508_8_ = *(undefined8 *)&(local_38->end).z;
  local_2c0._496_4_ = (undefined4)*(undefined8 *)&(local_38->begin).z;
  local_2c0._520_8_ = *(undefined8 *)(domain->smallend).vect;
  uVar7 = *(undefined8 *)(domain->bigend).vect;
  uVar66 = *(undefined8 *)((domain->bigend).vect + 2);
  iStack_b0 = (int)*(undefined8 *)((domain->smallend).vect + 2);
  iStack_ac = (int)uVar7;
  local_a8 = (int)((ulong)uVar7 >> 0x20);
  iStack_a4 = (int)uVar66;
  IStack_a0.itype = (uint)((ulong)uVar66 >> 0x20);
  local_98 = vfrac->p;
  local_78.x = (vfrac->begin).x;
  local_78.y = (vfrac->begin).y;
  uVar97 = (vfrac->end).x;
  uVar98 = (vfrac->end).y;
  uStack_64 = *(undefined8 *)&(vfrac->end).z;
  iStack_90 = (int)vfrac->jstride;
  iStack_8c = (int)((ulong)vfrac->jstride >> 0x20);
  local_88 = (int)vfrac->kstride;
  iStack_84 = (int)((ulong)vfrac->kstride >> 0x20);
  iStack_80 = (int)vfrac->nstride;
  uStack_7c = (undefined4)((ulong)vfrac->nstride >> 0x20);
  local_78.z = (int)*(undefined8 *)&(vfrac->begin).z;
  local_58 = 2;
  local_54 = is_velocity;
  if (0 < ncomp) {
    iVar104 = 0;
    local_2c0._56_4_ = uVar84;
    local_2c0._120_4_ = uVar85;
    local_2c0._180_4_ = uVar86;
    local_2c0._184_4_ = uVar87;
    local_2c0._244_4_ = uVar88;
    local_2c0._248_4_ = uVar89;
    local_2c0._308_4_ = uVar90;
    local_2c0._312_4_ = uVar91;
    local_2c0._372_4_ = uVar92;
    local_2c0._376_4_ = uVar93;
    local_2c0._440_4_ = uVar94;
    local_2c0._500_4_ = uVar95;
    local_2c0._504_4_ = uVar96;
    iStack_6c = uVar97;
    iStack_68 = uVar98;
    do {
      iVar103 = iVar3;
      if (iVar3 <= iVar101) {
        do {
          iVar102 = iVar2;
          if (iVar2 <= iVar5) {
            do {
              iVar107 = iVar1;
              if (iVar1 <= iVar4) {
                do {
                  ComputeEdgeState::anon_class_624_13_b5b87481::operator()
                            ((anon_class_624_13_b5b87481 *)local_2c0,iVar107,iVar102,iVar103,iVar104
                            );
                  iVar107 = iVar107 + 1;
                } while (iVar4 + 1 != iVar107);
              }
              bVar110 = iVar102 != iVar5;
              iVar102 = iVar102 + 1;
            } while (bVar110);
          }
          bVar110 = iVar103 != iVar101;
          iVar103 = iVar103 + 1;
        } while (bVar110);
      }
      iVar104 = iVar104 + 1;
    } while (iVar104 != ncomp);
  }
  return;
}

Assistant:

void
EBMOL::ComputeEdgeState ( Box const& bx,
                          AMREX_D_DECL( Array4<Real> const& xedge,
                                        Array4<Real> const& yedge,
                                        Array4<Real> const& zedge),
                          Array4<Real const> const& q,
                          const int ncomp,
                          AMREX_D_DECL( Array4<Real const> const& umac,
                                        Array4<Real const> const& vmac,
                                        Array4<Real const> const& wmac),
                          const Box&       domain,
                          const Vector<BCRec>& bcs,
                          const        BCRec * d_bcrec_ptr,
                          AMREX_D_DECL( Array4<Real const> const& fcx,
                                        Array4<Real const> const& fcy,
                                        Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Array4<Real const> const& vfrac,
                          Array4<EBCellFlag const> const& flag,
                          const bool is_velocity)
{

    int order = 2;

    AMREX_D_TERM( const Box& ubx = amrex::surroundingNodes(bx,0);,
                  const Box& vbx = amrex::surroundingNodes(bx,1);,
                  const Box& wbx = amrex::surroundingNodes(bx,2););

    AMREX_D_TERM(
        const int domain_ilo = domain.smallEnd(0);
        const int domain_ihi = domain.bigEnd(0);,
        const int domain_jlo = domain.smallEnd(1);
        const int domain_jhi = domain.bigEnd(1);,
        const int domain_klo = domain.smallEnd(2);
        const int domain_khi = domain.bigEnd(2););

    // ****************************************************************************
    // Decide whether the stencil at each cell might need to see values that
    //     live on face centroids rather than cell centroids, i.e.
    //     are at a domain boundary with ext_dir or hoextrap boundary conditions
    // ****************************************************************************

    auto extdir_lohi_x = has_extdir_or_ho(bcs.dataPtr(), ncomp, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;

    auto extdir_lohi_y = has_extdir_or_ho(bcs.dataPtr(), ncomp, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z = has_extdir_or_ho(bcs.dataPtr(), ncomp, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif


    if ((has_extdir_or_ho_lo_x && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {

        // ****************************************************************************
        // Predict to x-faces
        // ****************************************************************************
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr,q,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                        flag,umac, xedge, domain, vfrac, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
           if (flag(i,j,k).isConnected(-1,0,0))
           {
               xedge(i,j,k,n) = EBMOL::hydro_ebmol_xedge_state_extdir( AMREX_D_DECL(i, j, k), n, q, umac,
                                                                       AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                       flag, d_bcrec_ptr, domain, order, is_velocity );
           }
           else
           {
               xedge(i,j,k,n) = 0.0;
           }
        });

        // ****************************************************************************
        // Predict to y-faces
        // ****************************************************************************
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr,q,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                        flag,vmac,yedge,domain,vfrac,order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                yedge(i,j,k,n) = EBMOL::hydro_ebmol_yedge_state_extdir( AMREX_D_DECL(i, j, k), n, q, vmac,
                                        AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                        flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                yedge(i,j,k,n) = 0.0;
            }
        });

#if ( AMREX_SPACEDIM == 3 )
        // ****************************************************************************
        // Predict to z-faces
        // ****************************************************************************
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr,q,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                        flag,wmac,zedge,domain,vfrac,order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                zedge(i,j,k,n) = EBMOL::hydro_ebmol_zedge_state_extdir( i, j, k, n, q, wmac,
                                        AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                        flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                zedge(i,j,k,n) = 0.0;
            }
        });
#endif
    }
    else // We assume below that the stencil does not need to use hoextrap or extdir boundaries
    {
        // ****************************************************************************
        // Predict to x-faces
        // ****************************************************************************
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr, q,ccc,AMREX_D_DECL(fcx,fcy,fcz),flag, umac, xedge, vfrac, domain, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
           if (flag(i,j,k).isConnected(-1,0,0))
           {
                xedge(i,j,k,n) = EBMOL::hydro_ebmol_xedge_state( AMREX_D_DECL(i, j, k), n, q, umac,
                                                                 AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                 flag, d_bcrec_ptr, domain, order, is_velocity );
           }
           else
           {
                xedge(i,j,k,n) = 0.0;
           }
        });

        // ****************************************************************************
        // Predict to y-faces
        // ****************************************************************************
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr, q,ccc,AMREX_D_DECL(fcx,fcy,fcz),flag, vmac, yedge, vfrac, domain, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                yedge(i,j,k,n) = EBMOL::hydro_ebmol_yedge_state( AMREX_D_DECL(i, j, k), n, q, vmac,
                                                                 AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                 flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                yedge(i,j,k,n) = 0.0;
            }
        });

#if ( AMREX_SPACEDIM == 3 )
        // ****************************************************************************
        // Predict to z-faces
        // ****************************************************************************
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr, q,ccc,AMREX_D_DECL(fcx,fcy,fcz),flag, wmac, zedge, vfrac, domain, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                zedge(i,j,k,n) = EBMOL::hydro_ebmol_zedge_state( AMREX_D_DECL(i, j, k), n, q, wmac,
                                                                 AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                 flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                zedge(i,j,k,n) = 0.0;
            }
        });
#endif
    }

}